

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O2

string * cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                   (string *__return_storage_ptr__,string *globalGenerator,string *extraGenerator)

{
  string sStack_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (globalGenerator->_M_string_length != 0) {
    if (extraGenerator->_M_string_length != 0) {
      local_48.View_._M_str = (extraGenerator->_M_dataplus)._M_p;
      local_78.View_._M_len = 3;
      local_78.View_._M_str = " - ";
      local_48.View_._M_len = extraGenerator->_M_string_length;
      cmStrCat<>(&sStack_98,&local_48,&local_78);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_98);
      std::__cxx11::string::~string((string *)&sStack_98);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
  const std::string& globalGenerator, const std::string& extraGenerator)
{
  std::string fullName;
  if (!globalGenerator.empty()) {
    if (!extraGenerator.empty()) {
      fullName = cmStrCat(extraGenerator, " - ");
    }
    fullName += globalGenerator;
  }
  return fullName;
}